

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O3

void parse_filename(string *file_name,string *part_name,bool *force_part_name,int *part_num)

{
  int iVar1;
  long lVar2;
  invalid_argument *this;
  string num;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  *force_part_name = false;
  std::__cxx11::string::_M_assign((string *)part_name);
  lVar2 = std::__cxx11::string::rfind((char *)file_name,0x10c05e,0xffffffffffffffff);
  if (lVar2 == -1) {
    parse_partname(part_name);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)file_name);
    std::__cxx11::string::operator=((string *)part_name,(string *)&local_70);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    std::__cxx11::string::substr((ulong)&local_70,(ulong)file_name);
    std::__cxx11::string::operator=((string *)file_name,(string *)&local_70);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    *force_part_name = true;
  }
  lVar2 = std::__cxx11::string::rfind((char)file_name,0x3a);
  if (lVar2 == -1) {
    *part_num = -1;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)file_name);
    if (local_68 == 0) {
LAB_00104ea6:
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"part number must be a number");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    lVar2 = 0;
    do {
      if (9 < (int)*(char *)((long)local_70 + lVar2) - 0x30U) {
        if (local_68 != lVar2) goto LAB_00104ea6;
        break;
      }
      lVar2 = lVar2 + 1;
    } while (local_68 != lVar2);
    iVar1 = atoi((char *)local_70);
    *part_num = iVar1;
    std::__cxx11::string::substr((ulong)local_50,(ulong)file_name);
    std::__cxx11::string::operator=((string *)file_name,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  return;
}

Assistant:

void
parse_filename (
    string& file_name, string& part_name, bool& force_part_name, int& part_num)
{
    force_part_name    = false;
    part_name          = file_name; // default is the file_name
    size_t doublecolon = file_name.rfind ("::");
    if (doublecolon != string::npos)
    {
        part_name       = file_name.substr (doublecolon + 2);
        file_name       = file_name.substr (0, doublecolon);
        force_part_name = true;
    }
    else
    {
        parse_partname (part_name);
    }

    size_t colon = file_name.rfind (':');
    if (colon == string::npos)
    {
        part_num = -1; // use all parts
    }
    else
    {
        string num = file_name.substr (colon + 1);
        if (is_number (num))
        {
            part_num  = atoi (num.c_str ());
            file_name = file_name.substr (0, colon);
        }
        else
        {
            throw invalid_argument("part number must be a number");
    }
    }
}